

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_225155::OSSPlayback::reset(OSSPlayback *this)

{
  ALuint AVar1;
  ALuint AVar2;
  ALCuint a;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ALCchar *pAVar6;
  long in_RDI;
  char *err;
  audio_buf_info info;
  ALuint numFragmentsLogSize;
  ALuint log2FragmentSize;
  ALuint frameSize;
  ALuint ossSpeed;
  ALuint numChannels;
  ALuint periods;
  int ossFormat;
  BackendBase *in_stack_ffffffffffffff80;
  FILE *pFVar7;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_> *in_stack_ffffffffffffff90;
  char *local_48;
  int local_3c [2];
  uint local_34;
  uint local_2c;
  uint local_28;
  uint local_24;
  undefined4 local_20;
  ALuint local_1c;
  uint local_18;
  uint local_14 [5];
  
  local_14[0] = 0;
  switch(*(undefined1 *)(*(long *)(in_RDI + 8) + 0x19)) {
  case 0:
    local_14[0] = 0x40;
    break;
  case 1:
    local_14[0] = 8;
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 2;
  case 2:
    local_14[0] = 0x10;
  }
  local_18 = *(uint *)(*(long *)(in_RDI + 8) + 0x14) / *(uint *)(*(long *)(in_RDI + 8) + 0x10);
  AVar1 = ALCdevice::channelsFromFmt((ALCdevice *)0x23863d);
  local_20 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc);
  local_1c = AVar1;
  AVar2 = ALCdevice::bytesFromFmt((ALCdevice *)0x238664);
  local_24 = AVar1 * AVar2;
  a = log2i(*(int *)(*(long *)(in_RDI + 8) + 0x10) * local_24);
  local_28 = maxu(a,4);
  local_2c = local_18 << 0x10 | local_28;
  memset(local_3c,0,0x10);
  ioctl(*(int *)(in_RDI + 0x10),0xc004500a,&local_2c);
  iVar3 = ioctl(*(int *)(in_RDI + 0x10),0xc0045005,local_14);
  if (iVar3 < 0) {
    local_48 = "ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat)";
  }
  else {
    iVar3 = ioctl(*(int *)(in_RDI + 0x10),0xc0045006,&local_1c);
    if (iVar3 < 0) {
      local_48 = "ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels)";
    }
    else {
      iVar3 = ioctl(*(int *)(in_RDI + 0x10),0xc0045002,&local_20);
      if (iVar3 < 0) {
        local_48 = "ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed)";
      }
      else {
        iVar3 = ioctl(*(int *)(in_RDI + 0x10),0x8010500c,local_3c);
        if (-1 < iVar3) {
          AVar1 = ALCdevice::channelsFromFmt((ALCdevice *)0x238809);
          if (AVar1 != local_1c) {
            if (0 < (int)gLogLevel) {
              pFVar7 = (FILE *)gLogFile;
              pAVar6 = DevFmtChannelsString(*(DevFmtChannels *)(*(long *)(in_RDI + 8) + 0x18));
              fprintf(pFVar7,"[ALSOFT] (EE) Failed to set %s, got %d channels instead\n",pAVar6,
                      (ulong)local_1c);
            }
            return false;
          }
          if ((((local_14[0] != 0x40) || (*(char *)(*(long *)(in_RDI + 8) + 0x19) != '\0')) &&
              ((local_14[0] != 8 || (*(char *)(*(long *)(in_RDI + 8) + 0x19) != '\x01')))) &&
             ((local_14[0] != 0x10 || (*(char *)(*(long *)(in_RDI + 8) + 0x19) != '\x02')))) {
            if (0 < (int)gLogLevel) {
              pFVar7 = (FILE *)gLogFile;
              pAVar6 = DevFmtTypeString(*(DevFmtType *)(*(long *)(in_RDI + 8) + 0x19));
              fprintf(pFVar7,"[ALSOFT] (EE) Failed to set %s samples, got OSS format %#x\n",pAVar6,
                      (ulong)local_14[0]);
            }
            return false;
          }
          *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc) = local_20;
          *(uint *)(*(long *)(in_RDI + 8) + 0x10) = local_34 / local_24;
          *(int *)(*(long *)(in_RDI + 8) + 0x14) =
               local_3c[0] * *(int *)(*(long *)(in_RDI + 8) + 0x10);
          BackendBase::setDefaultChannelOrder(in_stack_ffffffffffffff80);
          ALCdevice::frameSizeFromFmt((ALCdevice *)(in_RDI + 0x18));
          std::vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_>::resize
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          return true;
        }
        local_48 = "ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info)";
      }
    }
  }
  if (0 < (int)gLogLevel) {
    pFVar7 = (FILE *)gLogFile;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar7,"[ALSOFT] (EE) %s failed: %s\n",local_48,pcVar5);
  }
  return false;
}

Assistant:

bool OSSPlayback::reset()
{
    int ossFormat{};
    switch(mDevice->FmtType)
    {
        case DevFmtByte:
            ossFormat = AFMT_S8;
            break;
        case DevFmtUByte:
            ossFormat = AFMT_U8;
            break;
        case DevFmtUShort:
        case DevFmtInt:
        case DevFmtUInt:
        case DevFmtFloat:
            mDevice->FmtType = DevFmtShort;
            /* fall-through */
        case DevFmtShort:
            ossFormat = AFMT_S16_NE;
            break;
    }

    ALuint periods{mDevice->BufferSize / mDevice->UpdateSize};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    /* According to the OSS spec, 16 bytes (log2(16)) is the minimum. */
    ALuint log2FragmentSize{maxu(log2i(mDevice->UpdateSize*frameSize), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
    const char *err;
#define CHECKERR(func) if((func) < 0) {                                       \
    err = #func;                                                              \
    goto err;                                                                 \
}
    /* Don't fail if SETFRAGMENT fails. We can handle just about anything
     * that's reported back via GETOSPACE */
    ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize);
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info));
    if(0)
    {
    err:
        ERR("%s failed: %s\n", err, strerror(errno));
        return false;
    }
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
    {
        ERR("Failed to set %s, got %d channels instead\n", DevFmtChannelsString(mDevice->FmtChans),
            numChannels);
        return false;
    }

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte) ||
         (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte) ||
         (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
    {
        ERR("Failed to set %s samples, got OSS format %#x\n", DevFmtTypeString(mDevice->FmtType),
            ossFormat);
        return false;
    }

    mDevice->Frequency = ossSpeed;
    mDevice->UpdateSize = static_cast<ALuint>(info.fragsize) / frameSize;
    mDevice->BufferSize = static_cast<ALuint>(info.fragments) * mDevice->UpdateSize;

    setDefaultChannelOrder();

    mMixData.resize(mDevice->UpdateSize * mDevice->frameSizeFromFmt());

    return true;
}